

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stats.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  string_view filename_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  col_names;
  vector<long_double,_std::allocator<long_double>_> vars;
  vector<long_double,_std::allocator<long_double>_> means;
  vector<long_double,_std::allocator<long_double>_> max;
  vector<long_double,_std::allocator<long_double>_> min;
  string filename;
  CSVStat stats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  vector<long_double,_std::allocator<long_double>_> local_298;
  vector<long_double,_std::allocator<long_double>_> local_280;
  vector<long_double,_std::allocator<long_double>_> local_268;
  vector<long_double,_std::allocator<long_double>_> local_250;
  long *local_238;
  size_t local_230;
  long local_228 [2];
  CSVFormat local_218;
  CSVStat local_1c0;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,argv[1],(allocator<char> *)&local_1c0);
    plVar1 = local_238;
    csv::CSVFormat::guess_csv();
    filename_00._M_str = (char *)plVar1;
    filename_00._M_len = local_230;
    csv::CSVStat::CSVStat(&local_1c0,filename_00,&local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218.col_names);
    if (local_218.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_218.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.trim_chars.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_218.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.possible_delimiters.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_218.possible_delimiters.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.possible_delimiters.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    csv::CSVReader::get_col_names_abi_cxx11_(&local_2b0,&local_1c0.reader);
    csv::CSVStat::get_mins(&local_250,&local_1c0);
    csv::CSVStat::get_maxes(&local_268,&local_1c0);
    csv::CSVStat::get_mean(&local_280,&local_1c0);
    csv::CSVStat::get_variance(&local_298,&local_1c0);
    if (local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            *(char **)((long)&((local_2b0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar3 * 2),
                            *(long *)((long)&(local_2b0.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_string_length + lVar3 * 2));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Min: ",5);
        poVar2 = std::ostream::_M_insert<long_double>
                           (*(longdouble *)
                             ((long)local_250.
                                    super__Vector_base<long_double,_std::allocator<long_double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Max: ",5);
        poVar2 = std::ostream::_M_insert<long_double>
                           (*(longdouble *)
                             ((long)local_268.
                                    super__Vector_base<long_double,_std::allocator<long_double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Mean: ",6);
        poVar2 = std::ostream::_M_insert<long_double>
                           (*(longdouble *)
                             ((long)local_280.
                                    super__Vector_base<long_double,_std::allocator<long_double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        poVar2 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Var: ",5);
        poVar2 = std::ostream::_M_insert<long_double>
                           (*(longdouble *)
                             ((long)local_298.
                                    super__Vector_base<long_double,_std::allocator<long_double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < (ulong)((long)local_2b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2b0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_298.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_280.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_280.super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_280.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_280.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_268.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_268.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_250.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<long_double,_std::allocator<long_double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<long_double,_std::allocator<long_double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0);
    csv::CSVStat::~CSVStat(&local_1c0);
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar2 = std::operator<<(poVar2,*argv);
  poVar2 = std::operator<<(poVar2," [file]");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string filename = argv[1];
    CSVStat stats(filename);

    auto col_names = stats.get_col_names();
    auto min = stats.get_mins(), max = stats.get_maxes(),
        means = stats.get_mean(), vars = stats.get_variance();

    for (size_t i = 0; i < col_names.size(); i++) {
        std::cout << col_names[i] << std::endl
            << "Min: " << min[i] << std::endl
            << "Max: " << max[i] << std::endl
            << "Mean: " << means[i] << std::endl
            << "Var: " << vars[i] << std::endl;
    }

    return 0;
}